

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateCommonBuilderMethods
          (MessageBuilderGenerator *this,Printer *printer)

{
  Context *pCVar1;
  ClassNameResolver *this_00;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FieldDescriptor *pFVar6;
  OneofDescriptor *pOVar7;
  ImmutableFieldGenerator *pIVar8;
  OneofGeneratorInfo *pOVar9;
  FileDescriptor *descriptor;
  string *s;
  Descriptor *descriptor_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar10;
  undefined8 extraout_RDX_03;
  string local_2d0;
  string local_2b0;
  FieldDescriptor *local_290;
  FieldDescriptor *field_1;
  int local_280;
  int j;
  int i_10;
  int i_9;
  string local_258;
  string local_238;
  string local_218;
  int local_1f4;
  undefined1 local_1f0 [4];
  int i_8;
  uint local_1d0;
  int local_1cc;
  int i_7;
  int i_6;
  uint local_1a4;
  undefined1 local_1a0 [4];
  int i_5;
  uint local_17c;
  int local_178;
  int i_4;
  int totalMessageInts;
  int totalBuilderInts;
  ImmutableFieldGenerator *field;
  int local_160;
  int i_3;
  int totalMessageBits;
  int totalBuilderBits;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  int local_b4;
  int local_b0;
  int i_2;
  int i_1;
  int i;
  string local_88;
  string local_68;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageBuilderGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_38,this->name_resolver_,this->descriptor_);
  io::Printer::Print(printer,
                     "// Construct using $classname$.newBuilder()\nprivate Builder() {\n  maybeForceBuilderInitialization();\n}\n\n"
                     ,"classname",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pPVar2 = local_18;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_68,this->name_resolver_,this->descriptor_);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::Print(pPVar2,
                     "private Builder(\n    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n  super(parent);\n  maybeForceBuilderInitialization();\n}\n"
                     ,"classname",&local_68,"ver",&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  pPVar2 = local_18;
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::Print(pPVar2,
                     "private void maybeForceBuilderInitialization() {\n  if (com.google.protobuf.GeneratedMessage$ver$\n          .alwaysUseFieldBuilders) {\n"
                     ,"ver",(string *)&i_1);
  std::__cxx11::string::~string((string *)&i_1);
  io::Printer::Indent(local_18);
  io::Printer::Indent(local_18);
  for (i_2 = 0; iVar5 = i_2, iVar4 = Descriptor::field_count(this->descriptor_), iVar5 < iVar4;
      i_2 = i_2 + 1) {
    pFVar6 = Descriptor::field(this->descriptor_,i_2);
    pOVar7 = FieldDescriptor::containing_oneof(pFVar6);
    if (pOVar7 == (OneofDescriptor *)0x0) {
      pFVar6 = Descriptor::field(this->descriptor_,i_2);
      pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,pFVar6);
      (*pIVar8->_vptr_ImmutableFieldGenerator[0x10])(pIVar8,local_18);
    }
  }
  io::Printer::Outdent(local_18);
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"  }\n}\n");
  io::Printer::Print(local_18,"public Builder clear() {\n  super.clear();\n");
  io::Printer::Indent(local_18);
  for (local_b0 = 0; iVar5 = local_b0, iVar4 = Descriptor::field_count(this->descriptor_),
      iVar5 < iVar4; local_b0 = local_b0 + 1) {
    pFVar6 = Descriptor::field(this->descriptor_,local_b0);
    pOVar7 = FieldDescriptor::containing_oneof(pFVar6);
    if (pOVar7 == (OneofDescriptor *)0x0) {
      pFVar6 = Descriptor::field(this->descriptor_,local_b0);
      pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,pFVar6);
      (*pIVar8->_vptr_ImmutableFieldGenerator[8])(pIVar8,local_18);
    }
  }
  for (local_b4 = 0; iVar5 = local_b4, iVar4 = Descriptor::oneof_decl_count(this->descriptor_),
      pPVar2 = local_18, iVar5 < iVar4; local_b4 = local_b4 + 1) {
    pCVar1 = this->context_;
    pOVar7 = Descriptor::oneof_decl(this->descriptor_,local_b4);
    pOVar9 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
    io::Printer::Print(pPVar2,"$oneof_name$Case_ = 0;\n$oneof_name$_ = null;\n","oneof_name",
                       &pOVar9->name);
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"  return this;\n}\n\n");
  pPVar2 = local_18;
  this_00 = this->name_resolver_;
  descriptor = Descriptor::file(this->descriptor_);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_d8,this_00,descriptor);
  UniqueFileScopeIdentifier_abi_cxx11_(&local_f8,(java *)this->descriptor_,descriptor_00);
  io::Printer::Print(pPVar2,
                     "public com.google.protobuf.Descriptors.Descriptor\n    getDescriptorForType() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
                     ,"fileclass",&local_d8,"identifier",&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  pPVar2 = local_18;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_118,this->name_resolver_,this->descriptor_);
  io::Printer::Print(pPVar2,
                     "public $classname$ getDefaultInstanceForType() {\n  return $classname$.getDefaultInstance();\n}\n\n"
                     ,"classname",&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  pPVar2 = local_18;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_138,this->name_resolver_,this->descriptor_);
  io::Printer::Print(pPVar2,
                     "public $classname$ build() {\n  $classname$ result = buildPartial();\n  if (!result.isInitialized()) {\n    throw newUninitializedMessageException(result);\n  }\n  return result;\n}\n\n"
                     ,"classname",&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  pPVar2 = local_18;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&totalMessageBits,this->name_resolver_,this->descriptor_);
  io::Printer::Print(pPVar2,
                     "public $classname$ buildPartial() {\n  $classname$ result = new $classname$(this);\n"
                     ,"classname",(string *)&totalMessageBits);
  std::__cxx11::string::~string((string *)&totalMessageBits);
  io::Printer::Indent(local_18);
  i_3 = 0;
  local_160 = 0;
  for (field._4_4_ = 0; iVar5 = field._4_4_, iVar4 = Descriptor::field_count(this->descriptor_),
      iVar5 < iVar4; field._4_4_ = field._4_4_ + 1) {
    pFVar6 = Descriptor::field(this->descriptor_,field._4_4_);
    _totalMessageInts =
         FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                   (&this->field_generators_,pFVar6);
    iVar5 = (*_totalMessageInts->_vptr_ImmutableFieldGenerator[3])();
    i_3 = iVar5 + i_3;
    iVar5 = (*_totalMessageInts->_vptr_ImmutableFieldGenerator[2])();
    local_160 = iVar5 + local_160;
  }
  i_4 = (i_3 + 0x1f) / 0x20;
  local_178 = (local_160 + 0x1f) / 0x20;
  bVar3 = anon_unknown_7::GenerateHasBits(this->descriptor_);
  if (bVar3) {
    uVar10 = extraout_RDX;
    for (local_17c = 0; pPVar2 = local_18, (int)local_17c < i_4; local_17c = local_17c + 1) {
      GetBitFieldName_abi_cxx11_((string *)local_1a0,(java *)(ulong)local_17c,(int)uVar10);
      io::Printer::Print(pPVar2,"int from_$bit_field_name$ = $bit_field_name$;\n","bit_field_name",
                         (string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      uVar10 = extraout_RDX_00;
    }
    for (local_1a4 = 0; pPVar2 = local_18, (int)local_1a4 < local_178; local_1a4 = local_1a4 + 1) {
      GetBitFieldName_abi_cxx11_((string *)&i_7,(java *)(ulong)local_1a4,(int)uVar10);
      io::Printer::Print(pPVar2,"int to_$bit_field_name$ = 0;\n","bit_field_name",(string *)&i_7);
      std::__cxx11::string::~string((string *)&i_7);
      uVar10 = extraout_RDX_01;
    }
  }
  for (local_1cc = 0; iVar5 = local_1cc, iVar4 = Descriptor::field_count(this->descriptor_),
      iVar5 < iVar4; local_1cc = local_1cc + 1) {
    pFVar6 = Descriptor::field(this->descriptor_,local_1cc);
    pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,pFVar6);
    (*pIVar8->_vptr_ImmutableFieldGenerator[10])(pIVar8,local_18);
  }
  bVar3 = anon_unknown_7::GenerateHasBits(this->descriptor_);
  if (bVar3) {
    uVar10 = extraout_RDX_02;
    for (local_1d0 = 0; pPVar2 = local_18, (int)local_1d0 < local_178; local_1d0 = local_1d0 + 1) {
      GetBitFieldName_abi_cxx11_((string *)local_1f0,(java *)(ulong)local_1d0,(int)uVar10);
      io::Printer::Print(pPVar2,"result.$bit_field_name$ = to_$bit_field_name$;\n","bit_field_name",
                         (string *)local_1f0);
      std::__cxx11::string::~string((string *)local_1f0);
      uVar10 = extraout_RDX_03;
    }
  }
  for (local_1f4 = 0; iVar5 = local_1f4, iVar4 = Descriptor::oneof_decl_count(this->descriptor_),
      pPVar2 = local_18, iVar5 < iVar4; local_1f4 = local_1f4 + 1) {
    pCVar1 = this->context_;
    pOVar7 = Descriptor::oneof_decl(this->descriptor_,local_1f4);
    pOVar9 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
    io::Printer::Print(pPVar2,"result.$oneof_name$Case_ = $oneof_name$Case_;\n","oneof_name",
                       &pOVar9->name);
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"  onBuilt();\n");
  pPVar2 = local_18;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_218,this->name_resolver_,this->descriptor_);
  io::Printer::Print(pPVar2,"  return result;\n}\n\n","classname",&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  io::Printer::Print(local_18,
                     "public Builder clone() {\n  return (Builder) super.clone();\n}\npublic Builder setField(\n    com.google.protobuf.Descriptors.FieldDescriptor field,\n    Object value) {\n  return (Builder) super.setField(field, value);\n}\npublic Builder clearField(\n    com.google.protobuf.Descriptors.FieldDescriptor field) {\n  return (Builder) super.clearField(field);\n}\npublic Builder clearOneof(\n    com.google.protobuf.Descriptors.OneofDescriptor oneof) {\n  return (Builder) super.clearOneof(oneof);\n}\npublic Builder setRepeatedField(\n    com.google.protobuf.Descriptors.FieldDescriptor field,\n    int index, Object value) {\n  return (Builder) super.setRepeatedField(field, index, value);\n}\npublic Builder addRepeatedField(\n    com.google.protobuf.Descriptors.FieldDescriptor field,\n    Object value) {\n  return (Builder) super.addRepeatedField(field, value);\n}\n"
                    );
  iVar5 = Descriptor::extension_range_count(this->descriptor_);
  pPVar2 = local_18;
  if (0 < iVar5) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_238,this->name_resolver_,this->descriptor_);
    io::Printer::Print(pPVar2,
                       "public <Type> Builder setExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, Type> extension,\n    Type value) {\n  return (Builder) super.setExtension(extension, value);\n}\npublic <Type> Builder setExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, java.util.List<Type>> extension,\n    int index, Type value) {\n  return (Builder) super.setExtension(extension, index, value);\n}\npublic <Type> Builder addExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, java.util.List<Type>> extension,\n    Type value) {\n  return (Builder) super.addExtension(extension, value);\n}\npublic <Type> Builder clearExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, ?> extension) {\n  return (Builder) super.clearExtension(extension);\n}\n"
                       ,"classname",&local_238);
    std::__cxx11::string::~string((string *)&local_238);
  }
  bVar3 = Context::HasGeneratedMethods(this->context_,this->descriptor_);
  pPVar2 = local_18;
  if (bVar3) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_258,this->name_resolver_,this->descriptor_);
    io::Printer::Print(pPVar2,
                       "public Builder mergeFrom(com.google.protobuf.Message other) {\n  if (other instanceof $classname$) {\n    return mergeFrom(($classname$)other);\n  } else {\n    super.mergeFrom(other);\n    return this;\n  }\n}\n\n"
                       ,"classname",&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    pPVar2 = local_18;
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&i_10,this->name_resolver_,this->descriptor_);
    io::Printer::Print(pPVar2,
                       "public Builder mergeFrom($classname$ other) {\n  if (other == $classname$.getDefaultInstance()) return this;\n"
                       ,"classname",(string *)&i_10);
    std::__cxx11::string::~string((string *)&i_10);
    io::Printer::Indent(local_18);
    for (j = 0; iVar5 = j, iVar4 = Descriptor::field_count(this->descriptor_), iVar5 < iVar4;
        j = j + 1) {
      pFVar6 = Descriptor::field(this->descriptor_,j);
      pOVar7 = FieldDescriptor::containing_oneof(pFVar6);
      if (pOVar7 == (OneofDescriptor *)0x0) {
        pFVar6 = Descriptor::field(this->descriptor_,j);
        pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&this->field_generators_,pFVar6);
        (*pIVar8->_vptr_ImmutableFieldGenerator[9])(pIVar8,local_18);
      }
    }
    for (local_280 = 0; iVar5 = local_280, iVar4 = Descriptor::oneof_decl_count(this->descriptor_),
        pPVar2 = local_18, iVar5 < iVar4; local_280 = local_280 + 1) {
      pCVar1 = this->context_;
      pOVar7 = Descriptor::oneof_decl(this->descriptor_,local_280);
      pOVar9 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
      io::Printer::Print(pPVar2,"switch (other.get$oneof_capitalized_name$Case()) {\n",
                         "oneof_capitalized_name",&pOVar9->capitalized_name);
      io::Printer::Indent(local_18);
      field_1._4_4_ = 0;
      while( true ) {
        iVar5 = field_1._4_4_;
        pOVar7 = Descriptor::oneof_decl(this->descriptor_,local_280);
        iVar4 = OneofDescriptor::field_count(pOVar7);
        pPVar2 = local_18;
        if (iVar4 <= iVar5) break;
        pOVar7 = Descriptor::oneof_decl(this->descriptor_,local_280);
        local_290 = OneofDescriptor::field(pOVar7,field_1._4_4_);
        pPVar2 = local_18;
        s = FieldDescriptor::name_abi_cxx11_(local_290);
        ToUpper(&local_2b0,s);
        io::Printer::Print(pPVar2,"case $field_name$: {\n","field_name",&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        io::Printer::Indent(local_18);
        pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&this->field_generators_,local_290);
        (*pIVar8->_vptr_ImmutableFieldGenerator[9])(pIVar8,local_18);
        io::Printer::Print(local_18,"break;\n");
        io::Printer::Outdent(local_18);
        io::Printer::Print(local_18,"}\n");
        field_1._4_4_ = field_1._4_4_ + 1;
      }
      pCVar1 = this->context_;
      pOVar7 = Descriptor::oneof_decl(this->descriptor_,local_280);
      pOVar9 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
      ToUpper(&local_2d0,&pOVar9->name);
      io::Printer::Print(pPVar2,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name",
                         &local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      io::Printer::Outdent(local_18);
      io::Printer::Print(local_18,"}\n");
    }
    io::Printer::Outdent(local_18);
    iVar5 = Descriptor::extension_range_count(this->descriptor_);
    if (0 < iVar5) {
      io::Printer::Print(local_18,"  this.mergeExtensionFields(other);\n");
    }
    bVar3 = PreserveUnknownFields(this->descriptor_);
    if (bVar3) {
      io::Printer::Print(local_18,"  this.mergeUnknownFields(other.unknownFields);\n");
    }
    io::Printer::Print(local_18,"  onChanged();\n");
    io::Printer::Print(local_18,"  return this;\n}\n\n");
  }
  return;
}

Assistant:

void MessageBuilderGenerator::
GenerateCommonBuilderMethods(io::Printer* printer) {
  printer->Print(
      "// Construct using $classname$.newBuilder()\n"
      "private Builder() {\n"
      "  maybeForceBuilderInitialization();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "private Builder(\n"
    "    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n"
    "  super(parent);\n"
    "  maybeForceBuilderInitialization();\n"
    "}\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_),
    "ver", GeneratedCodeVersionSuffix());

  printer->Print(
    "private void maybeForceBuilderInitialization() {\n"
    "  if (com.google.protobuf.GeneratedMessage$ver$\n"
    "          .alwaysUseFieldBuilders) {\n",
    "ver", GeneratedCodeVersionSuffix());

  printer->Indent();
  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateFieldBuilderInitializationCode(printer);
    }
  }
  printer->Outdent();
  printer->Outdent();

  printer->Print(
    "  }\n"
    "}\n");

  printer->Print(
    "public Builder clear() {\n"
    "  super.clear();\n");

  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateBuilderClearCode(printer);
    }
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "$oneof_name$Case_ = 0;\n"
      "$oneof_name$_ = null;\n",
      "oneof_name", context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
  }

  printer->Outdent();

  printer->Print(
    "  return this;\n"
    "}\n"
    "\n");

  printer->Print(
    "public com.google.protobuf.Descriptors.Descriptor\n"
    "    getDescriptorForType() {\n"
    "  return $fileclass$.internal_$identifier$_descriptor;\n"
    "}\n"
    "\n",
    "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
    "identifier", UniqueFileScopeIdentifier(descriptor_));

  // LITE runtime implements this in GeneratedMessageLite.
  printer->Print(
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return $classname$.getDefaultInstance();\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "public $classname$ build() {\n"
    "  $classname$ result = buildPartial();\n"
    "  if (!result.isInitialized()) {\n"
    "    throw newUninitializedMessageException(result);\n"
    "  }\n"
    "  return result;\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "public $classname$ buildPartial() {\n"
    "  $classname$ result = new $classname$(this);\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();

  int totalBuilderBits = 0;
  int totalMessageBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const ImmutableFieldGenerator& field =
        field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
    totalMessageBits += field.GetNumBitsForMessage();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  int totalMessageInts = (totalMessageBits + 31) / 32;

  if (GenerateHasBits(descriptor_)) {
    // Local vars for from and to bit fields to avoid accessing the builder and
    // message over and over for these fields. Seems to provide a slight
    // perforamance improvement in micro benchmark and this is also what proto1
    // code does.
    for (int i = 0; i < totalBuilderInts; i++) {
      printer->Print("int from_$bit_field_name$ = $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
    for (int i = 0; i < totalMessageInts; i++) {
      printer->Print("int to_$bit_field_name$ = 0;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // Output generation code for each field.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i)).GenerateBuildingCode(printer);
  }

  if (GenerateHasBits(descriptor_)) {
    // Copy the bit field results to the generated message
    for (int i = 0; i < totalMessageInts; i++) {
      printer->Print("result.$bit_field_name$ = to_$bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print("result.$oneof_name$Case_ = $oneof_name$Case_;\n",
                   "oneof_name", context_->GetOneofGeneratorInfo(
                       descriptor_->oneof_decl(i))->name);
  }

  printer->Outdent();

  printer->Print(
    "  onBuilt();\n");

  printer->Print(
    "  return result;\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Override methods declared in GeneratedMessage to return the concrete
  // generated type so callsites won't depend on GeneratedMessage. This
  // is needed to keep binary compatibility when we change generated code
  // to subclass a different GeneratedMessage class (e.g., in v3.0.0 release
  // we changed all generated code to subclass GeneratedMessageV3).
  printer->Print(
    "public Builder clone() {\n"
    "  return (Builder) super.clone();\n"
    "}\n"
    "public Builder setField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field,\n"
    "    Object value) {\n"
    "  return (Builder) super.setField(field, value);\n"
    "}\n"
    "public Builder clearField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field) {\n"
    "  return (Builder) super.clearField(field);\n"
    "}\n"
    "public Builder clearOneof(\n"
    "    com.google.protobuf.Descriptors.OneofDescriptor oneof) {\n"
    "  return (Builder) super.clearOneof(oneof);\n"
    "}\n"
    "public Builder setRepeatedField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field,\n"
    "    int index, Object value) {\n"
    "  return (Builder) super.setRepeatedField(field, index, value);\n"
    "}\n"
    "public Builder addRepeatedField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field,\n"
    "    Object value) {\n"
    "  return (Builder) super.addRepeatedField(field, value);\n"
    "}\n");

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "public <Type> Builder setExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, Type> extension,\n"
      "    Type value) {\n"
      "  return (Builder) super.setExtension(extension, value);\n"
      "}\n"
      "public <Type> Builder setExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, java.util.List<Type>> extension,\n"
      "    int index, Type value) {\n"
      "  return (Builder) super.setExtension(extension, index, value);\n"
      "}\n"
      "public <Type> Builder addExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, java.util.List<Type>> extension,\n"
      "    Type value) {\n"
      "  return (Builder) super.addExtension(extension, value);\n"
      "}\n"
      "public <Type> Builder clearExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, ?> extension) {\n"
      "  return (Builder) super.clearExtension(extension);\n"
      "}\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));
  }

  // -----------------------------------------------------------------

  if (context_->HasGeneratedMethods(descriptor_)) {
    printer->Print(
      "public Builder mergeFrom(com.google.protobuf.Message other) {\n"
      "  if (other instanceof $classname$) {\n"
      "    return mergeFrom(($classname$)other);\n"
      "  } else {\n"
      "    super.mergeFrom(other);\n"
      "    return this;\n"
      "  }\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

    printer->Print(
      "public Builder mergeFrom($classname$ other) {\n"
      // Optimization:  If other is the default instance, we know none of its
      //   fields are set so we can skip the merge.
      "  if (other == $classname$.getDefaultInstance()) return this;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (!descriptor_->field(i)->containing_oneof()) {
        field_generators_.get(
            descriptor_->field(i)).GenerateMergingCode(printer);
      }
    }

    // Merge oneof fields.
    for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
      printer->Print(
        "switch (other.get$oneof_capitalized_name$Case()) {\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(
            descriptor_->oneof_decl(i))->capitalized_name);
      printer->Indent();
      for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
        const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
        printer->Print(
          "case $field_name$: {\n",
          "field_name",
          ToUpper(field->name()));
        printer->Indent();
        field_generators_.get(field).GenerateMergingCode(printer);
        printer->Print(
            "break;\n");
        printer->Outdent();
        printer->Print(
            "}\n");
      }
      printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(context_->GetOneofGeneratorInfo(
            descriptor_->oneof_decl(i))->name));
      printer->Outdent();
      printer->Print(
          "}\n");
    }

    printer->Outdent();

    // if message type has extensions
    if (descriptor_->extension_range_count() > 0) {
      printer->Print(
        "  this.mergeExtensionFields(other);\n");
    }

    if (PreserveUnknownFields(descriptor_)) {
      printer->Print(
        "  this.mergeUnknownFields(other.unknownFields);\n");
    }

    printer->Print(
      "  onChanged();\n");

    printer->Print(
      "  return this;\n"
      "}\n"
      "\n");
  }
}